

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

size_t __thiscall wallet::CWallet::KeypoolCountExternalKeys(CWallet *this)

{
  long lVar1;
  int iVar2;
  LegacyScriptPubKeyMan *this_00;
  size_t sVar3;
  _Base_ptr p_Var4;
  uint uVar5;
  _Rb_tree_header *p_Var6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = GetLegacyScriptPubKeyMan(this);
  if (this_00 == (LegacyScriptPubKeyMan *)0x0) {
    p_Var4 = (this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(this->m_external_spk_managers)._M_t._M_impl.super__Rb_tree_header;
    sVar3 = 0;
    if ((_Rb_tree_header *)p_Var4 != p_Var6) {
      do {
        iVar2 = (**(code **)(*(long *)p_Var4[1]._M_parent + 0x90))();
        uVar5 = (int)sVar3 + iVar2;
        sVar3 = (size_t)uVar5;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var6);
      sVar3 = (size_t)uVar5;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return sVar3;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    sVar3 = LegacyScriptPubKeyMan::KeypoolCountExternalKeys(this_00);
    return sVar3;
  }
  __stack_chk_fail();
}

Assistant:

size_t CWallet::KeypoolCountExternalKeys() const
{
    AssertLockHeld(cs_wallet);

    auto legacy_spk_man = GetLegacyScriptPubKeyMan();
    if (legacy_spk_man) {
        return legacy_spk_man->KeypoolCountExternalKeys();
    }

    unsigned int count = 0;
    for (auto spk_man : m_external_spk_managers) {
        count += spk_man.second->GetKeyPoolSize();
    }

    return count;
}